

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O2

AnimationCurveNodeList * __thiscall
Assimp::FBX::AnimationLayer::Nodes
          (AnimationCurveNodeList *__return_storage_ptr__,AnimationLayer *this,
          char **target_prop_whitelist,size_t whitelist_size)

{
  char *__s1;
  int iVar1;
  Object *pOVar2;
  pointer ppCVar3;
  size_t i;
  size_t sVar4;
  AnimationCurveNode *anim;
  allocator local_81;
  AnimationCurveNodeList *local_80;
  AnimationLayer *local_78;
  value_type local_70;
  _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_68;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = __return_storage_ptr__;
  local_78 = this;
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&local_68,this->doc,(this->super_Object).id,"AnimationCurveNode");
  std::
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  ::reserve(__return_storage_ptr__,
            (long)local_68._M_impl.super__Vector_impl_data._M_finish -
            (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
  ppCVar3 = local_68._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppCVar3 == local_68._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ::~_Vector_base(&local_68);
      return local_80;
    }
    if (((*ppCVar3)->prop)._M_string_length == 0) {
      pOVar2 = Connection::SourceObject(*ppCVar3);
      if (pOVar2 == (Object *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring"
                   ,(allocator *)&local_70);
        Util::DOMWarning(&local_50,(local_78->super_Object).element);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        local_70 = (value_type)
                   __dynamic_cast(pOVar2,&Object::typeinfo,&AnimationCurveNode::typeinfo,0);
        if (local_70 == (value_type)0x0) {
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "source object for ->AnimationLayer link is not an AnimationCurveNode",
                     &local_81);
          Util::DOMWarning(&local_50,(local_78->super_Object).element);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          if (target_prop_whitelist != (char **)0x0) {
            __s1 = (local_70->prop)._M_dataplus._M_p;
            sVar4 = 0;
            do {
              if (whitelist_size == sVar4) goto LAB_0017799d;
              iVar1 = strcmp(__s1,target_prop_whitelist[sVar4]);
              sVar4 = sVar4 + 1;
            } while (iVar1 != 0);
          }
          std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::push_back(local_80,&local_70);
        }
      }
    }
LAB_0017799d:
    ppCVar3 = ppCVar3 + 1;
  } while( true );
}

Assistant:

AnimationCurveNodeList AnimationLayer::Nodes(const char* const * target_prop_whitelist /*= NULL*/,
    size_t whitelist_size /*= 0*/) const
{
    AnimationCurveNodeList nodes;

    // resolve attached animation nodes
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"AnimationCurveNode");
    nodes.reserve(conns.size());

    for(const Connection* con : conns) {

        // link should not go to a property
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for AnimationCurveNode->AnimationLayer link, ignoring",&element);
            continue;
        }

        const AnimationCurveNode* const anim = dynamic_cast<const AnimationCurveNode*>(ob);
        if(!anim) {
            DOMWarning("source object for ->AnimationLayer link is not an AnimationCurveNode",&element);
            continue;
        }

        if(target_prop_whitelist) {
            const char* s = anim->TargetProperty().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }
            if(!ok) {
                continue;
            }
        }
        nodes.push_back(anim);
    }

    return nodes; // pray for NRVO
}